

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cpp
# Opt level: O0

_Type_CALLBACK * __thiscall
LiteScript::_Type_CALLBACK::ToString_abi_cxx11_(_Type_CALLBACK *this,Variable *object)

{
  bool bVar1;
  Object *this_00;
  Callback *this_01;
  ostream *poVar2;
  Variable *in_RDX;
  Callback *C;
  stringstream ss;
  ostream local_198 [376];
  Variable *local_20;
  Variable *object_local;
  _Type_CALLBACK *this_local;
  
  local_20 = in_RDX;
  object_local = object;
  this_local = this;
  std::__cxx11::stringstream::stringstream((stringstream *)&C);
  this_00 = Variable::operator->(local_20);
  this_01 = Object::GetData<LiteScript::Callback>(this_00);
  bVar1 = Callback::isInternal(this_01);
  if (bVar1) {
    std::operator<<(local_198,"f(internal)");
  }
  else {
    poVar2 = std::operator<<(local_198,"f(I=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*this_01->I);
    poVar2 = std::operator<<(poVar2,",L=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*this_01->L);
    std::operator<<(poVar2,")");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&C);
  return this;
}

Assistant:

std::string LiteScript::_Type_CALLBACK::ToString(const Variable &object) const {
    std::stringstream ss;
    const Callback& C = object->GetData<Callback>();
    if (C.isInternal())
        ss << "f(internal)";
    else
        ss << "f(I=" << C.I << ",L=" << C.L << ")";
    return ss.str();
}